

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O1

uint * Dtt_ManLoadClasses(int nVars,int *pnClasses)

{
  uint *pTable;
  int nSizeW;
  char pFileName [200];
  char acStack_e8 [200];
  
  nSizeW = 1 << ((char)(1 << ((byte)nVars & 0x1f)) - 2U & 0x1f);
  sprintf(acStack_e8,"tableW%d.data");
  pTable = Dau_ReadFile2(acStack_e8,nSizeW);
  if (pTable == (uint *)0x0) {
    Dau_TruthEnum(nVars);
    pTable = Dau_ReadFile2(acStack_e8,nSizeW);
  }
  Dtt_ManRenum(nVars,pTable,pnClasses);
  return pTable;
}

Assistant:

unsigned * Dtt_ManLoadClasses( int nVars, int * pnClasses )
{
    extern void Dau_TruthEnum(int nVars);
    unsigned * pTable = NULL;
    int nSizeLog = (1<<nVars) -2;
    int nSizeW = 1 << nSizeLog;
    char pFileName[200];
    sprintf( pFileName, "tableW%d.data", nSizeLog );
    pTable = Dau_ReadFile2( pFileName, nSizeW );
    if (pTable == NULL)
    {
        Dau_TruthEnum(nVars);
        pTable = Dau_ReadFile2( pFileName, nSizeW );
    }
    Dtt_ManRenum( nVars, pTable, pnClasses );
    return pTable;
}